

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

int ps_decode_senscr(ps_decoder_t *ps,FILE *senfh)

{
  int iVar1;
  int iVar2;
  
  ps_start_utt(ps);
  acmod_set_insenfh(ps->acmod,senfh);
  iVar2 = 0;
  while( true ) {
    iVar1 = acmod_read_scores(ps->acmod);
    if (iVar1 < 1) {
      ps_end_utt(ps);
      acmod_set_insenfh(ps->acmod,(FILE *)0x0);
      return iVar2;
    }
    iVar1 = ps_search_forward(ps);
    if (iVar1 < 0) break;
    iVar2 = iVar2 + iVar1;
  }
  ps_end_utt(ps);
  return iVar1;
}

Assistant:

int
ps_decode_senscr(ps_decoder_t *ps, FILE *senfh)
{
    int nfr, n_searchfr;

    ps_start_utt(ps);
    n_searchfr = 0;
    acmod_set_insenfh(ps->acmod, senfh);
    while ((nfr = acmod_read_scores(ps->acmod)) > 0) {
        if ((nfr = ps_search_forward(ps)) < 0) {
            ps_end_utt(ps);
            return nfr;
        }
        n_searchfr += nfr;
    }
    ps_end_utt(ps);
    acmod_set_insenfh(ps->acmod, NULL);

    return n_searchfr;
}